

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O1

size_t __thiscall proto2_unittest::StringParseTester::ByteSizeLong(StringParseTester *this)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  size_t sVar4;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *pVVar5;
  uint uVar6;
  int n;
  long lVar7;
  
  sVar4 = google::protobuf::internal::ExtensionSet::ByteSize(&(this->field_0)._impl_._extensions_);
  uVar3 = *(uint *)((long)&this->field_0 + 0x28);
  lVar7 = sVar4 + uVar3;
  if (0 < (int)uVar3) {
    uVar6 = 0;
    do {
      pVVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                         (&(this->field_0)._impl_.repeated_string_lowfield_.
                           super_RepeatedPtrFieldBase,uVar6);
      uVar2 = (uint)pVVar5->_M_string_length | 1;
      iVar1 = 0x1f;
      if (uVar2 != 0) {
        for (; uVar2 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      lVar7 = lVar7 + pVVar5->_M_string_length + (ulong)(iVar1 * 9 + 0x49U >> 6);
      uVar6 = uVar6 + 1;
    } while (uVar3 != uVar6);
  }
  uVar3 = *(uint *)((long)&this->field_0 + 0x40);
  lVar7 = lVar7 + (ulong)uVar3 * 2;
  if (0 < (int)uVar3) {
    uVar6 = 0;
    do {
      pVVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                         (&(this->field_0)._impl_.repeated_string_midfield_.
                           super_RepeatedPtrFieldBase,uVar6);
      uVar2 = (uint)pVVar5->_M_string_length | 1;
      iVar1 = 0x1f;
      if (uVar2 != 0) {
        for (; uVar2 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      lVar7 = lVar7 + pVVar5->_M_string_length + (ulong)(iVar1 * 9 + 0x49U >> 6);
      uVar6 = uVar6 + 1;
    } while (uVar3 != uVar6);
  }
  uVar3 = *(uint *)((long)&this->field_0 + 0x58);
  sVar4 = lVar7 + (ulong)uVar3 * 4;
  if (0 < (int)uVar3) {
    uVar6 = 0;
    do {
      pVVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                         (&(this->field_0)._impl_.repeated_string_hifield_.
                           super_RepeatedPtrFieldBase,uVar6);
      uVar2 = (uint)pVVar5->_M_string_length | 1;
      iVar1 = 0x1f;
      if (uVar2 != 0) {
        for (; uVar2 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar4 = sVar4 + pVVar5->_M_string_length + (ulong)(iVar1 * 9 + 0x49U >> 6);
      uVar6 = uVar6 + 1;
    } while (uVar3 != uVar6);
  }
  uVar3 = *(uint *)((long)&this->field_0 + 0x18);
  if ((uVar3 & 7) != 0) {
    if ((uVar3 & 1) != 0) {
      lVar7 = *(long *)(((ulong)(this->field_0)._impl_.optional_string_lowfield_.tagged_ptr_.ptr_ &
                        0xfffffffffffffffc) + 8);
      uVar6 = (uint)lVar7 | 1;
      iVar1 = 0x1f;
      if (uVar6 != 0) {
        for (; uVar6 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar4 = sVar4 + lVar7 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar3 & 2) != 0) {
      lVar7 = *(long *)(((ulong)(this->field_0)._impl_.optional_string_midfield_.tagged_ptr_.ptr_ &
                        0xfffffffffffffffc) + 8);
      uVar6 = (uint)lVar7 | 1;
      iVar1 = 0x1f;
      if (uVar6 != 0) {
        for (; uVar6 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar4 = sVar4 + lVar7 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar3 & 4) != 0) {
      lVar7 = *(long *)(((ulong)(this->field_0)._impl_.optional_string_hifield_.tagged_ptr_.ptr_ &
                        0xfffffffffffffffc) + 8);
      uVar3 = (uint)lVar7 | 1;
      iVar1 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar4 = sVar4 + lVar7 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 4;
    }
  }
  sVar4 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar4,&(this->field_0)._impl_._cached_size_);
  return sVar4;
}

Assistant:

::size_t StringParseTester::ByteSizeLong() const {
  const StringParseTester& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto2_unittest.StringParseTester)
  ::size_t total_size = 0;
  total_size += this_._impl_._extensions_.ByteSize();

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated string repeated_string_lowfield = 2;
    {
      total_size +=
          1 * ::google::protobuf::internal::FromIntSize(this_._internal_repeated_string_lowfield().size());
      for (int i = 0, n = this_._internal_repeated_string_lowfield().size(); i < n; ++i) {
        total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
            this_._internal_repeated_string_lowfield().Get(i));
      }
    }
    // repeated string repeated_string_midfield = 1002;
    {
      total_size +=
          2 * ::google::protobuf::internal::FromIntSize(this_._internal_repeated_string_midfield().size());
      for (int i = 0, n = this_._internal_repeated_string_midfield().size(); i < n; ++i) {
        total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
            this_._internal_repeated_string_midfield().Get(i));
      }
    }
    // repeated string repeated_string_hifield = 1000002;
    {
      total_size +=
          4 * ::google::protobuf::internal::FromIntSize(this_._internal_repeated_string_hifield().size());
      for (int i = 0, n = this_._internal_repeated_string_hifield().size(); i < n; ++i) {
        total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
            this_._internal_repeated_string_hifield().Get(i));
      }
    }
  }
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000007u) != 0) {
    // string optional_string_lowfield = 1;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_optional_string_lowfield());
    }
    // string optional_string_midfield = 1001;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 2 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_optional_string_midfield());
    }
    // string optional_string_hifield = 1000001;
    if ((cached_has_bits & 0x00000004u) != 0) {
      total_size += 4 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_optional_string_hifield());
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}